

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall vm::VM::Tadd<int>(VM *this)

{
  int_t iVar1;
  int_t iVar2;
  int_t lhs;
  int_t rhs;
  VM *this_local;
  
  iVar1 = POP<int>(this);
  iVar2 = POP<int>(this);
  PUSH<int>(this,iVar2 + iVar1);
  return;
}

Assistant:

void VM::Tadd() {
    static_assert(std::is_arithmetic_v<T>);
    auto rhs = POP<T>();
    auto lhs = POP<T>();
    PUSH(lhs+rhs);
}